

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_cpu.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *format;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ALLEGRO_EVENT event;
  int local_78;
  int local_58;
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    al_init_font_addon();
    lVar6 = al_create_display(0x280,0x1e0);
    if (lVar6 == 0) {
      format = "Error creating display.\n";
    }
    else {
      cVar2 = al_install_keyboard();
      if (cVar2 != '\0') {
        uVar7 = al_create_builtin_font();
        uVar8 = al_create_timer(0x9999999a);
        uVar9 = al_create_event_queue();
        uVar10 = al_get_keyboard_event_source();
        al_register_event_source(uVar9,uVar10);
        uVar10 = al_get_timer_event_source(uVar8);
        al_register_event_source(uVar9,uVar10);
        uVar10 = al_get_display_event_source(lVar6);
        al_register_event_source(uVar9,uVar10);
        al_start_timer(uVar8);
        al_set_blender(0,1,3);
        do {
          bVar3 = al_is_event_queue_empty(uVar9);
          if (bVar3 != 0) {
            al_map_rgba_f(0,0,0,0x3f800000);
            al_clear_to_color();
            uVar12 = 0x3f800000;
            uVar11 = al_map_rgba_f(0x3f800000,0x3f800000,0,0x3f800000);
            uVar4 = al_get_cpu_count();
            al_draw_textf(uVar11,uVar12,0x41800000,0x41800000,uVar7,0,
                          "Amount of CPU cores detected: %d.",uVar4);
            uVar13 = 0x3f800000;
            uVar14 = 0;
            uVar12 = al_map_rgba_f(0,0x3f800000,0x3f800000,0x3f800000);
            uVar4 = extraout_XMM0_Dc;
            uVar11 = al_get_ram_size();
            al_draw_textf(uVar12,uVar13,0x41800000,0x42000000,uVar7,0,
                          "Size of random access memory: %d MiB.",uVar11,in_R8,in_R9,uVar13,uVar14,
                          uVar12,uVar4);
            al_flip_display();
          }
          bVar3 = bVar3 ^ 1;
          do {
            al_wait_for_event(uVar9);
            if (local_78 == 10) {
              if (local_58 == 0x3b) goto LAB_001025d0;
            }
            else {
              if (local_78 == 0x1e) break;
              if (local_78 == 0x2a) {
LAB_001025d0:
                al_destroy_font(uVar7);
                return 0;
              }
            }
            bVar1 = bVar3 & 1;
            bVar3 = 0;
          } while (bVar1 == 0);
        } while( true );
      }
      format = "Error installing keyboard.\n";
    }
  }
  abort_example(format);
  iVar5 = __cxa_atexit();
  return iVar5;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   al_init_font_addon();
   init_platform_specific();
   

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_create_builtin_font();

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgba_f(0, 0, 0, 1.0));
         al_draw_textf(font, al_map_rgba_f(1, 1, 0, 1.0), 16, 16, 0,
                       "Amount of CPU cores detected: %d.", al_get_cpu_count());
         al_draw_textf(font, al_map_rgba_f(0, 1, 1, 1.0), 16, 32, 0, 
                       "Size of random access memory: %d MiB.", al_get_ram_size());
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
               done = true;
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
      }
   }

   al_destroy_font(font);

   return 0;
}